

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

Duration * __thiscall absl::lts_20250127::Duration::operator*=(Duration *this,double r)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  HiRep HVar5;
  long lVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  HiRep HVar9;
  double hi_int;
  double local_38;
  double local_30;
  
  uVar1 = this->rep_lo_;
  if (0x7fefffffffffffff < (ulong)ABS(r) || uVar1 == 0xffffffff) {
    HVar5 = (HiRep)(-0x8000000000000000 - (ulong)(-1 < (int)(this->rep_hi_).hi_ != (long)r < 0));
    uVar7 = 0xffffffff;
    goto LAB_00342772;
  }
  HVar9.lo_ = 0xffffffff;
  HVar9.hi_ = 0x7fffffff;
  bVar4 = false;
  local_30 = 0.0;
  dVar2 = modf((double)(long)this->rep_hi_ * r,&local_30);
  local_38 = 0.0;
  dVar2 = modf(dVar2 + ((double)uVar1 * r) / 4000000000.0,&local_38);
  dVar2 = round(dVar2 * 4000000000.0);
  local_30 = local_30 + local_38;
  uVar7 = 0xffffffff;
  if (9.223372036854776e+18 <= local_30) {
    HVar5.lo_ = 0xffffffff;
    HVar5.hi_ = 0x7fffffff;
  }
  else {
    bVar4 = false;
    if (local_30 <= -9.223372036854776e+18) {
      HVar5.lo_ = 0;
      HVar5.hi_ = 0x80000000;
    }
    else {
      HVar5 = (HiRep)(long)local_30;
      bVar4 = true;
      uVar7 = 0;
    }
  }
  if (!bVar4) goto LAB_00342772;
  dVar3 = (double)((long)dVar2 / 4000000000) + (double)(long)HVar5;
  uVar8 = 0xffffffff;
  if (9.223372036854776e+18 <= dVar3) {
LAB_00342740:
    bVar4 = false;
    HVar5 = HVar9;
  }
  else {
    if (dVar3 <= -9.223372036854776e+18) {
      HVar9.lo_ = 0;
      HVar9.hi_ = 0x80000000;
      goto LAB_00342740;
    }
    bVar4 = true;
    HVar5 = (HiRep)(long)dVar3;
    uVar8 = uVar7;
  }
  uVar7 = uVar8;
  if (bVar4) {
    lVar6 = (long)dVar2 % 4000000000;
    HVar5 = (HiRep)((long)HVar5 + (lVar6 >> 0x3f));
    uVar7 = (uint32_t)lVar6 + 4000000000;
    if (-1 < lVar6) {
      uVar7 = (uint32_t)lVar6;
    }
  }
LAB_00342772:
  this->rep_hi_ = HVar5;
  this->rep_lo_ = uVar7;
  return this;
}

Assistant:

Duration& Duration::operator*=(double r) {
  if (time_internal::IsInfiniteDuration(*this) || !IsFinite(r)) {
    const bool is_neg = std::signbit(r) != (rep_hi_.Get() < 0);
    return *this = is_neg ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this = ScaleDouble<std::multiplies>(*this, r);
}